

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

string * __thiscall
t_java_generator::get_cap_name(string *__return_storage_ptr__,t_java_generator *this,string *name)

{
  char *pcVar1;
  int iVar2;
  string sStack_38;
  
  if (this->nocamel_style_ == true) {
    std::operator+(__return_storage_ptr__,"_",name);
  }
  else if (this->fullcamel_style_ == true) {
    std::__cxx11::string::string((string *)&sStack_38,(string *)name);
    as_camel_case(__return_storage_ptr__,(t_java_generator *)name,&sStack_38,true);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    iVar2 = toupper((int)*pcVar1);
    *pcVar1 = (char)iVar2;
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_java_generator::get_cap_name(std::string name) {
  if (nocamel_style_) {
    return "_" + name;
  } else if (fullcamel_style_) {
    return as_camel_case(name);
  } else {
    name[0] = toupper(name[0]);
    return name;
  }
}